

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

double __thiscall gmath::PinholeCamera::projectPoint(PinholeCamera *this,Vector2d *p,Vector3d *Pw)

{
  Distortion *pDVar1;
  Vector3d Pc;
  SVector<double,_3> local_c0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  SVector<double,_3> local_88;
  SMatrix<double,_3,_3> local_70;
  
  transpose<double,3,3>(&local_70,(gmath *)&(this->super_Camera).R,(SMatrix<double,_3,_3> *)Pw);
  SVector<double,_3>::operator-(&local_88,Pw,&(this->super_Camera).T);
  SMatrix<double,_3,_3>::operator*(&local_c0,&local_70,&local_88);
  local_a8 = this->rho;
  uStack_a0 = 0;
  local_98 = local_c0.v[2];
  uStack_90 = 0;
  SVector<double,_3>::operator/=(&local_c0,local_c0.v[2]);
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    (*pDVar1->_vptr_Distortion[6])(local_c0.v[0],pDVar1,&local_c0);
  }
  *(double *)p = (this->A).v[0][0] * local_c0.v[0] + (this->A).v[0][1] * local_c0.v[1] +
                 (this->A).v[0][2];
  *(double *)(p + 8) = local_c0.v[1] * (this->A).v[1][1] + (this->A).v[1][2];
  return (double)(~-(ulong)(0.0 < local_98) & 0xbff0000000000000 |
                 (~-(ulong)(local_a8 != 0.0) & 0x7ff0000000000000 |
                 (ulong)(local_a8 / local_98) & -(ulong)(local_a8 != 0.0)) &
                 -(ulong)(0.0 < local_98));
}

Assistant:

double PinholeCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  // transform into camera coordiante system

  Vector3d Pc=transpose(getR())*(Pw-getT());

  // if rho is given, then compute disparity and determine if the point
  // is behind the camera

  double d=std::numeric_limits<double>::infinity();

  if (rho != 0)
  {
    d=rho/Pc[2];
  }

  if (Pc[2] <= 0)
  {
    d=-1;
  }

  // apply lens distortion

  Pc/=Pc[2];

  if (dist != 0)
  {
    const double x=Pc[0];
    const double y=Pc[1];
    dist->transform(Pc[0], Pc[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*Pc[0]+A(0, 1)*Pc[1]+A(0, 2);
  p[1]=A(1, 1)*Pc[1]+A(1, 2);

  return d;
}